

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O0

void __thiscall nuraft::stat_elem::stat_elem(stat_elem *this,Type _type,string *_name)

{
  void *base;
  string *in_RDX;
  int in_ESI;
  int *in_RDI;
  __integral_type in_stack_ffffffffffffff98;
  atomic<long> *in_stack_ffffffffffffffa0;
  Histogram *this_00;
  
  *in_RDI = in_ESI;
  this_00 = (Histogram *)(in_RDI + 2);
  std::__cxx11::string::string((string *)this_00,in_RDX);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::atomic<long>::atomic(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (in_ESI == 1) {
    base = operator_new(0x30);
    Histogram::Histogram(this_00,(double)base);
  }
  else {
    base = (void *)0x0;
  }
  *(void **)(in_RDI + 0xe) = base;
  return;
}

Assistant:

stat_elem::stat_elem(Type _type, const std::string& _name)
    : stat_type_(_type)
    , stat_name_(_name)
    , counter_(0)
    , gauge_(0)
    , hist_( ( _type == HISTOGRAM )
             ? ( new Histogram() )
             : nullptr )
    {}